

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O1

void __thiscall Iir::LayoutBase::add(LayoutBase *this,ComplexPair *poles,ComplexPair *zeros)

{
  complex<double> *pcVar1;
  PoleZeroPair *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  invalid_argument *this_00;
  int iVar11;
  
  if ((this->m_numPoles & 1) == 0) {
    bVar10 = ComplexPair::isMatchedPair(poles);
    if (bVar10) {
      bVar10 = ComplexPair::isMatchedPair(zeros);
      if (bVar10) {
        uVar3 = *(undefined8 *)(poles->super_complex_pair_t).second._M_value;
        uVar4 = *(undefined8 *)((poles->super_complex_pair_t).second._M_value + 8);
        uVar5 = *(undefined8 *)(zeros->super_complex_pair_t).first._M_value;
        uVar6 = *(undefined8 *)((zeros->super_complex_pair_t).first._M_value + 8);
        uVar7 = *(undefined8 *)(zeros->super_complex_pair_t).second._M_value;
        uVar8 = *(undefined8 *)((zeros->super_complex_pair_t).second._M_value + 8);
        pPVar2 = this->m_pair;
        iVar11 = this->m_numPoles / 2;
        uVar9 = *(undefined8 *)((poles->super_complex_pair_t).first._M_value + 8);
        *(undefined8 *)pPVar2[iVar11].poles.super_complex_pair_t.first._M_value =
             *(undefined8 *)(poles->super_complex_pair_t).first._M_value;
        *(undefined8 *)(pPVar2[iVar11].poles.super_complex_pair_t.first._M_value + 8) = uVar9;
        pcVar1 = &pPVar2[iVar11].poles.super_complex_pair_t.second;
        *(undefined8 *)pcVar1->_M_value = uVar3;
        *(undefined8 *)(pcVar1->_M_value + 8) = uVar4;
        *(undefined8 *)pPVar2[iVar11].zeros.super_complex_pair_t.first._M_value = uVar5;
        *(undefined8 *)(pPVar2[iVar11].zeros.super_complex_pair_t.first._M_value + 8) = uVar6;
        pcVar1 = &pPVar2[iVar11].zeros.super_complex_pair_t.second;
        *(undefined8 *)pcVar1->_M_value = uVar7;
        *(undefined8 *)(pcVar1->_M_value + 8) = uVar8;
        this->m_numPoles = this->m_numPoles + 2;
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Zeros not complex conjugate.");
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Poles not complex conjugate.");
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Can\'t add 2nd order after a 1st order filter.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void add (const ComplexPair& poles, const ComplexPair& zeros)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (!poles.isMatchedPair ())
				throw_invalid_argument(errPolesNotComplexConj);
			if (!zeros.isMatchedPair ())
				throw_invalid_argument(errZerosNotComplexConj);
			m_pair[m_numPoles/2] = PoleZeroPair (poles.first, zeros.first,
							     poles.second, zeros.second);
			m_numPoles += 2;
		}